

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEDataPassThrough::initTest(TessellationShaderTCTEDataPassThrough *this)

{
  _tessellation_primitive_mode primitive_mode_00;
  deUint32 dVar1;
  NotSupportedError *this_00;
  RenderContext *pRVar2;
  _tessellation_primitive_mode extraout_var;
  TessellationShaderUtils *this_01;
  int iVar3;
  undefined1 local_148 [8];
  _run run;
  bool use_ts_pointsize_data;
  int n_ts_pointsize_usage;
  bool use_gs_pointsize_data;
  int n_gs_pointsize_usage;
  bool use_gs_stage;
  int n_gs_stage_usage;
  _tessellation_primitive_mode primitive_mode;
  uint n_primitive_mode;
  uint n_primitive_modes;
  _tessellation_primitive_mode primitive_modes [3];
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTCTEDataPassThrough *local_10;
  TessellationShaderTCTEDataPassThrough *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    primitive_modes[1] = (*pRVar2->_vptr_RenderContext[3])();
    primitive_modes[2] = extraout_var;
    this_01 = (TessellationShaderUtils *)operator_new(0x20);
    TessellationShaderUtils::TessellationShaderUtils
              (this_01,(Functions *)primitive_modes._4_8_,&this->super_TestCaseBase);
    this->m_utils_ptr = this_01;
    (**(code **)(primitive_modes._4_8_ + 0x708))(1,&this->m_vao_id);
    dVar1 = (**(code **)(primitive_modes._4_8_ + 0x800))();
    glu::checkError(dVar1,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xc3);
    (**(code **)(primitive_modes._4_8_ + 0xd8))(this->m_vao_id);
    dVar1 = (**(code **)(primitive_modes._4_8_ + 0x800))();
    glu::checkError(dVar1,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xc6);
    (**(code **)(primitive_modes._4_8_ + 0xfd8))
              ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
    dVar1 = (**(code **)(primitive_modes._4_8_ + 0x800))();
    glu::checkError(dVar1,"glPatchParameteriEXT() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xca);
    (**(code **)(primitive_modes._4_8_ + 0x5e0))(0x8c89);
    dVar1 = (**(code **)(primitive_modes._4_8_ + 0x800))();
    glu::checkError(dVar1,"glEnable(GL_RASTERIZER_DISCARD) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xce);
    (**(code **)(primitive_modes._4_8_ + 0x6c8))(1,&this->m_bo_id);
    dVar1 = (**(code **)(primitive_modes._4_8_ + 0x800))();
    glu::checkError(dVar1,"glGenBuffers() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xd2);
    (**(code **)(primitive_modes._4_8_ + 0x40))(0x8c8e,this->m_bo_id);
    dVar1 = (**(code **)(primitive_modes._4_8_ + 0x800))();
    glu::checkError(dVar1,"glBindBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xd6);
    (**(code **)(primitive_modes._4_8_ + 0x48))(0x8c8e,0,this->m_bo_id);
    dVar1 = (**(code **)(primitive_modes._4_8_ + 0x800))();
    glu::checkError(dVar1,"glBindBufferBase() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xd9);
    _n_primitive_mode = 0x200000000;
    primitive_modes[0] = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
    for (n_gs_stage_usage = 0; (uint)n_gs_stage_usage < 3; n_gs_stage_usage = n_gs_stage_usage + 1)
    {
      primitive_mode_00 = (&n_primitive_mode)[(uint)n_gs_stage_usage];
      n_gs_pointsize_usage = 0;
      while( true ) {
        iVar3 = 1;
        if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 0) {
          iVar3 = 2;
        }
        if (iVar3 <= n_gs_pointsize_usage) break;
        n_ts_pointsize_usage = 0;
        while( true ) {
          iVar3 = 1;
          if (((this->super_TestCaseBase).m_is_geometry_shader_point_size_supported & 1U) != 0) {
            iVar3 = 2;
          }
          if (iVar3 <= n_ts_pointsize_usage) break;
          run.result_te_position_data.
          super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          while( true ) {
            iVar3 = 1;
            if (((this->super_TestCaseBase).m_is_tessellation_shader_point_size_supported & 1U) != 0
               ) {
              iVar3 = 2;
            }
            if (iVar3 <= run.result_te_position_data.
                         super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_) break;
            run.result_te_position_data.
            super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._3_1_ =
                 run.result_te_position_data.
                 super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ == 1;
            if (((bool)run.result_te_position_data.
                       super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._3_1_) ||
               (n_ts_pointsize_usage != 1)) {
              _run::_run((_run *)local_148);
              executeTestRun(this,(_run *)local_148,primitive_mode_00,n_gs_pointsize_usage == 1,
                             n_ts_pointsize_usage == 1,
                             (bool)(run.result_te_position_data.
                                    super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1));
              std::
              vector<glcts::TessellationShaderTCTEDataPassThrough::_run,_std::allocator<glcts::TessellationShaderTCTEDataPassThrough::_run>_>
              ::push_back(&this->m_runs,(value_type *)local_148);
              _run::~_run((_run *)local_148);
            }
            run.result_te_position_data.
            super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 run.result_te_position_data.
                 super__Vector_base<glcts::_vec4,_std::allocator<glcts::_vec4>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          }
          n_ts_pointsize_usage = n_ts_pointsize_usage + 1;
        }
        n_gs_pointsize_usage = n_gs_pointsize_usage + 1;
      }
    }
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
             &local_31);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void TessellationShaderTCTEDataPassThrough::initTest()
{
	/* The test requires EXT_tessellation_shader */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Create an Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Our program objects take a single vertex per patch */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() call failed");

	/* Disable rasterization */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed");

	/* Create a buffer object we will use for XFB */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

	/* Set up XFB buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");

	/* Prepare all the runs */
	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	/* Iterate over all supported primitive modes */
	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		/* If geometry shaders are supported, include a separate iteration to include them
		 * in the pipeline
		 */
		for (int n_gs_stage_usage = 0; n_gs_stage_usage < ((m_is_geometry_shader_extension_supported) ? 2 : 1);
			 ++n_gs_stage_usage)
		{
			bool use_gs_stage = (n_gs_stage_usage == 1);

			/* If geometry shaders support gl_PointSize, include a separate iteration to pass
			 * point size data as well */
			for (int n_gs_pointsize_usage = 0;
				 n_gs_pointsize_usage < ((m_is_geometry_shader_point_size_supported) ? 2 : 1); ++n_gs_pointsize_usage)
			{
				bool use_gs_pointsize_data = (n_gs_pointsize_usage == 1);

				/* If tessellation shaders support gl_PointSize, include a separate iteration to pass
				 * point size data as well */
				for (int n_ts_pointsize_usage = 0;
					 n_ts_pointsize_usage < ((m_is_tessellation_shader_point_size_supported) ? 2 : 1);
					 ++n_ts_pointsize_usage)
				{
					bool use_ts_pointsize_data = (n_ts_pointsize_usage == 1);

					/* Note: it does not make sense to try to pass gl_PointSize data
					 *       in geometry stage if tessellation stage did not provide it.
					 */
					if (!use_ts_pointsize_data && use_gs_pointsize_data)
					{
						continue;
					}

					/* Initialize test run data */
					_run run;

					executeTestRun(run, primitive_mode, use_gs_stage, use_gs_pointsize_data, use_ts_pointsize_data);

					/* Store the run for later usage */
					m_runs.push_back(run);
				} /* for (tessellation point size data usage off and on cases) */
			}	 /* for (geometry point size data usage off and on cases) */
		}		  /* for (GS stage usage) */
	}			  /* for (all primitive modes) */
}